

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O1

int __thiscall
duckdb::Interpolator<true>::Extract<int,int>(Interpolator<true> *this,int *dest,Vector *result)

{
  uint uVar1;
  bool bVar2;
  undefined1 auVar3 [12];
  int result_1;
  int local_3c;
  string local_38;
  
  uVar1 = *dest;
  bVar2 = duckdb::TryCast::Operation<int,int>(uVar1,&local_3c,false);
  if (bVar2) {
    return local_3c;
  }
  auVar3 = __cxa_allocate_exception(0x10);
  CastExceptionText<int,int>(&local_38,(duckdb *)(ulong)uVar1,auVar3._8_4_);
  duckdb::InvalidInputException::InvalidInputException(auVar3._0_8_,(string *)&local_38);
  __cxa_throw(auVar3._0_8_,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static inline TARGET_TYPE Cast(const INPUT_TYPE &src, Vector &result) {
		return Cast::Operation<INPUT_TYPE, TARGET_TYPE>(src);
	}